

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void copy64(uint8_t *dst,uint64_t src)

{
  *(uint64_t *)dst =
       src >> 0x38 | (src & 0xff000000000000) >> 0x28 | (src & 0xff0000000000) >> 0x18 |
       (src & 0xff00000000) >> 8 | (src & 0xff000000) << 8 | (src & 0xff0000) << 0x18 |
       (src & 0xff00) << 0x28 | src << 0x38;
  return;
}

Assistant:

static inline void copy64(uint8_t *dst, uint64_t src)
{
    dst[0] = (uint8_t)(src >> 56);
    dst[1] = (uint8_t)(src >> 48);
    dst[2] = (uint8_t)(src >> 40);
    dst[3] = (uint8_t)(src >> 32);
    dst[4] = (uint8_t)(src >> 24);
    dst[5] = (uint8_t)(src >> 16);
    dst[6] = (uint8_t)(src >> 8);
    dst[7] = (uint8_t)src;
}